

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_nonblock.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  in_addr_t iVar3;
  uint uVar4;
  int __fd;
  int iVar5;
  LIBSSH2_SESSION *session;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  ulong extraout_RAX;
  long lVar9;
  long lVar10;
  long lVar11;
  timeval start;
  sockaddr_in sin;
  libssh2_struct_stat fileinfo;
  timeval end;
  ulong local_60f8;
  timeval local_60e8;
  sockaddr local_60d8;
  undefined1 local_60c8 [48];
  long local_6098;
  timeval local_6038 [1536];
  
  iVar3 = 0x100007f;
  if (1 < argc) {
    iVar3 = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    scppath = argv[4];
  }
  uVar4 = libssh2_init(0);
  if (uVar4 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar4);
    return 1;
  }
  __fd = socket(2,1,0);
  if (__fd == -1) {
    main_cold_6();
  }
  else {
    local_60d8.sa_family = 2;
    local_60d8.sa_data[0] = '\0';
    local_60d8.sa_data[1] = '\x16';
    local_60d8.sa_data._2_4_ = iVar3;
    iVar5 = connect(__fd,&local_60d8,0x10);
    if (iVar5 == 0) {
      session = (LIBSSH2_SESSION *)libssh2_session_init_ex(0,0,0,0);
      if (session != (LIBSSH2_SESSION *)0x0) {
        libssh2_session_set_blocking(session);
        gettimeofday(&local_60e8,(__timezone_ptr_t)0x0);
        do {
          uVar4 = libssh2_session_handshake(session,__fd);
        } while (uVar4 == 0xffffffdb);
        if (uVar4 == 0) {
          lVar6 = libssh2_hostkey_hash(session,2);
          fwrite("Fingerprint: ",0xd,1,_stderr);
          lVar10 = 0;
          do {
            fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar6 + lVar10));
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x14);
          fputc(10,_stderr);
          do {
            pcVar1 = username;
            sVar7 = strlen(username);
            pcVar2 = password;
            sVar8 = strlen(password);
            iVar5 = libssh2_userauth_password_ex
                              (session,pcVar1,sVar7 & 0xffffffff,pcVar2,sVar8 & 0xffffffff,0);
          } while (iVar5 == -0x25);
          if (iVar5 == 0) {
            fwrite("libssh2_scp_recv2().\n",0x15,1,_stderr);
            lVar6 = libssh2_scp_recv2(session,scppath,local_60c8);
            if (lVar6 == 0) {
              do {
                iVar5 = libssh2_session_last_errno(session);
                if (iVar5 != -0x25) {
                  main_cold_2();
                  goto LAB_001014ed;
                }
                main_cold_3();
                lVar6 = local_6038[0].tv_sec;
              } while ((extraout_RAX & 1) != 0);
            }
            fwrite("libssh2_scp_recv2() is done, now receive data.\n",0x2f,1,_stderr);
            local_60f8 = 0;
            lVar11 = 0;
            lVar10 = 0;
            while (lVar11 < local_6098) {
              while( true ) {
                lVar9 = (long)(int)(local_6098 - lVar11);
                if (0x5fff < local_6098 - lVar11) {
                  lVar9 = 0x6000;
                }
                sVar7 = libssh2_channel_read_ex(lVar6,0,local_6038,lVar9);
                if ((long)sVar7 < 1) break;
                write(1,local_6038,sVar7);
                lVar11 = lVar11 + sVar7;
                lVar10 = lVar10 + sVar7;
              }
              if (local_6098 <= lVar11 || sVar7 != 0xffffffffffffffdb) break;
              local_60f8 = (ulong)((int)local_60f8 + 1);
              waitsocket(__fd,session);
            }
            gettimeofday(local_6038,(__timezone_ptr_t)0x0);
            lVar11 = (local_6038[0].tv_usec - local_60e8.tv_usec) / 1000 +
                     (local_6038[0].tv_sec - local_60e8.tv_sec) * 1000;
            fprintf(_stderr,"Got %ld bytes in %ld ms = %.1f bytes/sec spin: %d\n",
                    (double)lVar10 / ((double)lVar11 / 1000.0),lVar10,lVar11,local_60f8);
            libssh2_channel_free(lVar6);
          }
          else {
            main_cold_4();
          }
        }
        else {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar4);
        }
        goto LAB_001014ed;
      }
      main_cold_5();
    }
    else {
      main_cold_1();
    }
  }
  session = (LIBSSH2_SESSION *)0x0;
LAB_001014ed:
  if (session != (LIBSSH2_SESSION *)0x0) {
    libssh2_session_disconnect_ex(session,0xb,"Normal Shutdown","");
    libssh2_session_free(session);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    libssh2_struct_stat fileinfo;
#ifdef HAVE_GETTIMEOFDAY
    struct timeval start;
    struct timeval end;
    long time_ms;
#endif
    int spin = 0;
    libssh2_struct_stat_size got = 0;
    libssh2_struct_stat_size total = 0;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        scppath = argv[4];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* Since we have set non-blocking, tell libssh2 we are non-blocking */
    libssh2_session_set_blocking(session, 0);

#ifdef HAVE_GETTIMEOFDAY
    gettimeofday(&start, NULL);
#endif

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed.\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        while((rc = libssh2_userauth_publickey_fromfile(session, username,
                                                        pubkey, privkey,
                                                        password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by public key failed.\n");
            goto shutdown;
        }
    }

#if 0
    libssh2_trace(session, LIBSSH2_TRACE_CONN);
#endif

    /* Request a file via SCP */
    fprintf(stderr, "libssh2_scp_recv2().\n");
    do {
        channel = libssh2_scp_recv2(session, scppath, &fileinfo);

        if(!channel) {
            if(libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
                char *err_msg;

                libssh2_session_last_error(session, &err_msg, NULL, 0);
                fprintf(stderr, "%s\n", err_msg);
                goto shutdown;
            }
            else {
                fprintf(stderr, "libssh2_scp_recv2() spin\n");
                waitsocket(sock, session);
            }
        }
    } while(!channel);
    fprintf(stderr, "libssh2_scp_recv2() is done, now receive data.\n");

    while(got < fileinfo.st_size) {
        char mem[1024 * 24];
        ssize_t nread;

        do {
            int amount = sizeof(mem);

            if((fileinfo.st_size - got) < amount) {
                amount = (int)(fileinfo.st_size - got);
            }

            /* loop until we block */
            nread = libssh2_channel_read(channel, mem, (size_t)amount);
            if(nread > 0) {
                write(1, mem, (size_t)nread);
                got += nread;
                total += nread;
            }
        } while(nread > 0);

        if(nread == LIBSSH2_ERROR_EAGAIN && got < fileinfo.st_size) {
            /* this is due to blocking that would occur otherwise
            so we loop on this condition */

            spin++;
            waitsocket(sock, session); /* now we wait */
            continue;
        }
        break;
    }

#ifdef HAVE_GETTIMEOFDAY
    gettimeofday(&end, NULL);

    time_ms = tvdiff(end, start);
    fprintf(stderr, "Got %ld bytes in %ld ms = %.1f bytes/sec spin: %d\n",
            (long)total, time_ms,
            (double)total / ((double)time_ms / 1000.0), spin);
#else
    fprintf(stderr, "Got %ld bytes spin: %d\n", (long)total, spin);
#endif

    libssh2_channel_free(channel);
    channel = NULL;

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}